

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitCallI(ParseNodeCall *pnodeCall,BOOL fEvaluateComponents,BOOL fIsEval,BOOL fHasNewTarget,
              uint32 actualArgCount,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
              ProfileId callSiteId,AuxArray<unsigned_int> *spreadIndices)

{
  byte bVar1;
  ParseNode *pnode;
  code *pcVar2;
  bool bVar3;
  OpCode op;
  CallFlags CVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  RegSlot RVar7;
  CallIExtendedOptions options;
  CallFlags callFlags;
  uint uVar8;
  uint byteCount;
  char cVar9;
  ArgSlot local_38;
  
  if (0xffff < actualArgCount) {
    Js::Throw::OutOfMemory();
  }
  pnode = pnodeCall->pnodeTarget;
  bVar1 = pnodeCall->field_0x24;
  if ((fEvaluateComponents != 0) && ((bVar1 & 8) == 0)) {
    FuncInfo::ReleaseLoc(funcInfo,pnode);
  }
  uVar8 = bVar1 & 8;
  if (((pnodeCall->super_ParseNode).field_0x1 & 1) != 0) {
    FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
  }
  cVar9 = (char)uVar8;
  if (fIsEval == 0) {
    CVar4 = uVar8 >> 3;
    callFlags = CVar4 + (CallFlags_NewTarget|CallFlags_ExtraArg);
    if (fHasNewTarget == 0) {
      callFlags = CVar4;
    }
    bVar3 = fHasNewTarget != 0 || cVar9 != '\0';
    if (pnodeCall->spreadArgCount == 0) {
      op = bVar3 + CallI;
    }
    else {
      op = bVar3 + CallIExtended;
    }
  }
  else {
    op = CallIExtendedFlags;
    callFlags = CallFlags_ExtraArg;
  }
  local_38 = (ArgSlot)actualArgCount;
  if ((ushort)(op - CallI) < 2) {
    if (cVar9 == '\0') {
      RVar7 = (pnodeCall->super_ParseNode).location;
      RVar5 = pnode->location;
    }
    else {
      RVar5 = ByteCodeGenerator::EmitLdObjProto
                        (byteCodeGenerator,LdFuncObjProto,pnode->location,funcInfo);
      RVar7 = (pnodeCall->super_ParseNode).location;
    }
    Js::ByteCodeWriter::CallI
              (&byteCodeGenerator->m_writer,op,RVar7,RVar5,local_38,callSiteId,callFlags);
    uVar8 = 0;
  }
  else {
    if (pnodeCall->spreadArgCount == 0) {
      uVar8 = 0;
      byteCount = 0;
      options = CallIExtended_None;
    }
    else {
      if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2054,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar3) goto LAB_0081e30c;
        *puVar6 = 0;
      }
      if (0x3fffffff < spreadIndices->count) {
LAB_0081e1bf:
        Math::DefaultOverflowPolicy();
      }
      uVar8 = spreadIndices->count * 4;
      options = CallIExtended_SpreadArgs;
      byteCount = uVar8 + 4;
      if (byteCount == 0) goto LAB_0081e1bf;
    }
    if (cVar9 == '\0') {
      RVar7 = (pnodeCall->super_ParseNode).location;
      RVar5 = pnode->location;
    }
    else {
      RVar5 = ByteCodeGenerator::EmitLdObjProto
                        (byteCodeGenerator,LdFuncObjProto,pnode->location,funcInfo);
      RVar7 = (pnodeCall->super_ParseNode).location;
    }
    Js::ByteCodeWriter::CallIExtended
              (&byteCodeGenerator->m_writer,op,RVar7,RVar5,local_38,options,spreadIndices,byteCount,
               callSiteId,callFlags);
  }
  if (pnodeCall->spreadArgCount == 0) {
    return;
  }
  if (uVar8 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2067,"(spreadExtraAlloc != 0)","spreadExtraAlloc != 0");
    if (!bVar3) {
LAB_0081e30c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
            (byteCodeGenerator->alloc,spreadIndices,(ulong)uVar8);
  return;
}

Assistant:

void EmitCallI(
    ParseNodeCall *pnodeCall,
    BOOL fEvaluateComponents,
    BOOL fIsEval,
    BOOL fHasNewTarget,
    uint32 actualArgCount,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::AuxArray<uint32> *spreadIndices = nullptr)
{
    // Emit a call where the target is in a register, because it's either a local name or an expression we've
    // already evaluated.

    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    Js::OpCode op;
    Js::CallFlags callFlags = Js::CallFlags::CallFlags_None;
    uint spreadExtraAlloc = 0;
    bool isSuperCall = pnodeCall->isSuperCall;

    Js::ArgSlot actualArgSlotCount = (Js::ArgSlot) actualArgCount;

    // check for integer overflow
    if ((size_t)actualArgSlotCount != actualArgCount)
    {
        Js::Throw::OutOfMemory();
    }

    
    if (fEvaluateComponents && !isSuperCall)
    {
        // Release the call target operands we assigned above. If we didn't assign them here,
        // we'll need them later, so we can't re-use them for the result of the call.
        funcInfo->ReleaseLoc(pnodeTarget);
    }
    // Grab a register for the call result.
    if (pnodeCall->isUsed)
    {
        funcInfo->AcquireLoc(pnodeCall);
    }

    if (fIsEval)
    {
        op = Js::OpCode::CallIExtendedFlags;
        callFlags = Js::CallFlags::CallFlags_ExtraArg;
    }
    else
    {
        if (isSuperCall)
        {
            callFlags = Js::CallFlags_New;
        }
        if (fHasNewTarget)
        {
            callFlags = (Js::CallFlags) (callFlags | Js::CallFlags::CallFlags_ExtraArg | Js::CallFlags::CallFlags_NewTarget);
        }

        if (pnodeCall->spreadArgCount > 0)
        {
            op = (isSuperCall || fHasNewTarget) ? Js::OpCode::CallIExtendedFlags : Js::OpCode::CallIExtended;
        }
        else
        {
            op = (isSuperCall || fHasNewTarget) ? Js::OpCode::CallIFlags : Js::OpCode::CallI;
        }
    }

    if (op == Js::OpCode::CallI || op == Js::OpCode::CallIFlags)
    {
        if (isSuperCall)
        {
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeTarget->location, funcInfo);
            byteCodeGenerator->Writer()->CallI(op, pnodeCall->location, tmpReg, actualArgSlotCount, callSiteId, callFlags);
        }
        else
        {
            byteCodeGenerator->Writer()->CallI(op, pnodeCall->location, pnodeTarget->location, actualArgSlotCount, callSiteId, callFlags);
        }
    }
    else
    {
        uint spreadIndicesSize = 0;
        Js::CallIExtendedOptions options = Js::CallIExtended_None;

        if (pnodeCall->spreadArgCount > 0)
        {
            Assert(spreadIndices != nullptr);
            spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
            spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
            options = Js::CallIExtended_SpreadArgs;
        }

        if (isSuperCall)
        {
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeTarget->location, funcInfo);
            byteCodeGenerator->Writer()->CallIExtended(op, pnodeCall->location, tmpReg, actualArgSlotCount, options, spreadIndices, spreadIndicesSize, callSiteId, callFlags);
        }
        else
        {
            byteCodeGenerator->Writer()->CallIExtended(op, pnodeCall->location, pnodeTarget->location, actualArgSlotCount, options, spreadIndices, spreadIndicesSize, callSiteId, callFlags);
        }
    }

    if (pnodeCall->spreadArgCount > 0)
    {
        Assert(spreadExtraAlloc != 0);
        AdeletePlus(byteCodeGenerator->GetAllocator(), spreadExtraAlloc, spreadIndices);
    }
}